

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Value * __thiscall toml::Value::setChild(Value *this,string *key,Value *v)

{
  Type TVar1;
  mapped_type *pmVar2;
  Value local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  local_58;
  
  TVar1 = this->type_;
  if (TVar1 == NULL_TYPE) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68.type_ = TABLE_TYPE;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68.field_1.null_ = operator_new(0x30);
    (((_Rep_type *)
     &(local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)->
    _M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(local_68.field_1.string_)->field_2 + 8) =
         (_Rb_tree_header *)&(local_68.field_1.string_)->_M_string_length;
    ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&(local_68.field_1.string_)->_M_string_length;
    ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (((_Rb_tree_header *)&(local_68.field_1.string_)->_M_string_length)->_M_header)._M_color =
         _S_red;
    if (&local_68 != this) {
      ~Value(this);
      this->type_ = local_68.type_;
      switch(local_68.type_) {
      case NULL_TYPE:
      case INT_TYPE:
      case STRING_TYPE:
      case TIME_TYPE:
      case ARRAY_TYPE:
      case TABLE_TYPE:
        (this->field_1).table_ = (Table *)local_68.field_1;
        break;
      case BOOL_TYPE:
        (this->field_1).bool_ = local_68.field_1.bool_;
        break;
      case DOUBLE_TYPE:
        (this->field_1).table_ = (Table *)local_68.field_1;
        break;
      default:
        this->type_ = NULL_TYPE;
        (this->field_1).null_ = (void *)0x0;
      }
      local_68.type_ = NULL_TYPE;
      local_68.field_1.null_ = (Table *)0x0;
    }
    ~Value(&local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree(&local_58);
    TVar1 = this->type_;
  }
  if (TVar1 != TABLE_TYPE) {
    failwith<char_const(&)[38]>((char (*) [38])"type must be table to do set(key, v).");
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                         *)(this->field_1).string_,key);
  if (pmVar2 != v) {
    ~Value(pmVar2);
    TVar1 = v->type_;
    pmVar2->type_ = TVar1;
    switch(TVar1) {
    case NULL_TYPE:
    case INT_TYPE:
    case STRING_TYPE:
    case TIME_TYPE:
    case ARRAY_TYPE:
    case TABLE_TYPE:
      pmVar2->field_1 = v->field_1;
      break;
    case BOOL_TYPE:
      (pmVar2->field_1).bool_ = (v->field_1).bool_;
      break;
    case DOUBLE_TYPE:
      pmVar2->field_1 = v->field_1;
      break;
    default:
      pmVar2->type_ = NULL_TYPE;
      (pmVar2->field_1).null_ = (void *)0x0;
    }
    v->type_ = NULL_TYPE;
    (v->field_1).null_ = (void *)0x0;
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                         *)(this->field_1).string_,key);
  return pmVar2;
}

Assistant:

inline Value* Value::setChild(const std::string& key, Value&& v)
{
    if (!valid())
        *this = Value((Table()));

    if (!is<Table>())
        failwith("type must be table to do set(key, v).");

    (*table_)[key] = std::move(v);
    return &(*table_)[key];
}